

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_match_accel.cpp
# Opt level: O0

bool __thiscall lzham::search_accelerator::find_len2_matches(search_accelerator *this)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  uint uVar6;
  uint32 uVar7;
  uint i;
  byte *pbVar8;
  uint *puVar9;
  long in_RDI;
  uint h;
  uint c1;
  uint c0;
  int lookahead_ofs;
  uint lookahead_dict_pos;
  uint new_size;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  uint local_18;
  uint local_14;
  bool local_1;
  
  uVar6 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x88));
  bVar5 = SUB81((ulong)in_RDI >> 0x18,0);
  new_size = (uint)((ulong)in_RDI >> 0x20);
  if ((uVar6 != 0) ||
     (bVar4 = vector<unsigned_int>::try_resize
                        ((vector<unsigned_int> *)
                         CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),new_size,
                         bVar5), bVar4)) {
    uVar6 = vector<unsigned_int>::size((vector<unsigned_int> *)(in_RDI + 0x98));
    if ((*(uint *)(in_RDI + 0x20) <= uVar6) ||
       (bVar5 = vector<unsigned_int>::try_resize
                          ((vector<unsigned_int> *)
                           CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),new_size,
                           bVar5), bVar5)) {
      local_14 = *(uint *)(in_RDI + 0x1c) & *(uint *)(in_RDI + 0x18);
      for (local_18 = 0; (int)local_18 < *(int *)(in_RDI + 0x20) + -1; local_18 = local_18 + 1) {
        pbVar8 = vector<unsigned_char>::operator[]
                           ((vector<unsigned_char> *)(in_RDI + 0x28),local_14);
        bVar1 = *pbVar8;
        pbVar8 = vector<unsigned_char>::operator[]
                           ((vector<unsigned_char> *)(in_RDI + 0x28),local_14 + 1);
        uVar7 = hash2_to_12((uint)bVar1,(uint)*pbVar8);
        i = uVar7 & 0xfff;
        puVar9 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x88),i);
        uVar2 = *puVar9;
        puVar9 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x98),local_18);
        *puVar9 = uVar2;
        iVar3 = *(int *)(in_RDI + 0x1c);
        puVar9 = vector<unsigned_int>::operator[]((vector<unsigned_int> *)(in_RDI + 0x88),i);
        *puVar9 = iVar3 + local_18;
        local_14 = local_14 + 1;
      }
      puVar9 = vector<unsigned_int>::operator[]
                         ((vector<unsigned_int> *)(in_RDI + 0x98),*(int *)(in_RDI + 0x20) - 1);
      *puVar9 = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool search_accelerator::find_len2_matches()
   {
      enum { cDigramHashSize = 4096 };

      if (!m_digram_hash.size())
      {
         if (!m_digram_hash.try_resize(cDigramHashSize))
            return false;
      }

      if (m_digram_next.size() < m_lookahead_size)
      {
         if (!m_digram_next.try_resize(m_lookahead_size))
            return false;
      }

      uint lookahead_dict_pos = m_lookahead_pos & m_max_dict_size_mask;

      for (int lookahead_ofs = 0; lookahead_ofs < ((int)m_lookahead_size - 1); ++lookahead_ofs, ++lookahead_dict_pos)
      {
         uint c0 = m_dict[lookahead_dict_pos];
         uint c1 = m_dict[lookahead_dict_pos + 1];

         uint h = hash2_to_12(c0, c1) & (cDigramHashSize - 1);

         m_digram_next[lookahead_ofs] = m_digram_hash[h];
         m_digram_hash[h] = m_lookahead_pos + lookahead_ofs;
      }

      m_digram_next[m_lookahead_size - 1] = 0;

      return true;
   }